

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-point.hpp
# Opt level: O0

void diy::Serialization<diy::DynamicPoint<long,_4UL>_>::save(BinaryBuffer *bb,Point *p)

{
  size_t sVar1;
  BinaryBuffer *bb_00;
  small_vector<long,_4UL,_0UL,_std::allocator<long>_> *in_RSI;
  long *in_RDI;
  size_t s;
  unsigned_long *in_stack_ffffffffffffffd8;
  small_vector<long,_4UL,_0UL,_std::allocator<long>_> *in_stack_ffffffffffffffe0;
  
  sVar1 = itlib::small_vector<long,_4UL,_0UL,_std::allocator<long>_>::size(in_RSI);
  save<unsigned_long>((BinaryBuffer *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (sVar1 != 0) {
    bb_00 = (BinaryBuffer *)
            itlib::small_vector<long,_4UL,_0UL,_std::allocator<long>_>::operator[]
                      (in_stack_ffffffffffffffe0,(size_type)in_RDI);
    itlib::small_vector<long,_4UL,_0UL,_std::allocator<long>_>::size(in_RSI);
    save<long>(bb_00,in_RDI,0x17089b);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Point& p)
    {
      size_t s = p.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &p[0], p.size());
    }